

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::rebuildOrderHeap(Solver *this)

{
  int iVar1;
  int local_2c;
  vec<int> local_28;
  
  local_28.data = (int *)0x0;
  local_28.sz = 0;
  local_28.cap = 0;
  local_2c = 0;
  iVar1 = (this->vardata).sz;
  if (0 < iVar1) {
    do {
      if (((this->decision).data[local_2c] != '\0') &&
         (((this->assigns).data[local_2c].value & 2) != 0)) {
        vec<int>::push(&local_28,&local_2c);
        iVar1 = (this->vardata).sz;
      }
      local_2c = local_2c + 1;
    } while (local_2c < iVar1);
  }
  Heap<Glucose::Solver::VarOrderLt>::build(&this->order_heap,&local_28);
  if (local_28.data != (int *)0x0) {
    local_28._8_8_ = local_28._8_8_ & 0xffffffff00000000;
    free(local_28.data);
  }
  return;
}

Assistant:

void Solver::rebuildOrderHeap() {
    vec <Var> vs;
    for(Var v = 0; v < nVars(); v++)
        if(decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);

}